

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O2

CcsDomain * __thiscall
ccs::CcsDomain::loadCcsStream
          (CcsDomain *this,istream *stream,string *fileName,ImportResolver *importResolver)

{
  Loader loader;
  undefined8 *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  Loader local_30;
  
  std::__shared_ptr<ccs::Node_const,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<ccs::Node,void>
            ((__shared_ptr<ccs::Node_const,(__gnu_cxx::_Lock_policy)2> *)&local_40,
             &(((this->dag)._M_t.
                super___uniq_ptr_impl<ccs::DagBuilder,_std::default_delete<ccs::DagBuilder>_>._M_t.
                super__Tuple_impl<0UL,_ccs::DagBuilder_*,_std::default_delete<ccs::DagBuilder>_>.
                super__Head_base<0UL,_ccs::DagBuilder_*,_false>._M_head_impl)->root_).
              super___shared_ptr<ccs::Node,_(__gnu_cxx::_Lock_policy)2>);
  local_30.trace = (CcsTracer *)*local_40;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  Loader::loadCcsStream
            (&local_30,stream,fileName,
             (this->dag)._M_t.
             super___uniq_ptr_impl<ccs::DagBuilder,_std::default_delete<ccs::DagBuilder>_>._M_t.
             super__Tuple_impl<0UL,_ccs::DagBuilder_*,_std::default_delete<ccs::DagBuilder>_>.
             super__Head_base<0UL,_ccs::DagBuilder_*,_false>._M_head_impl,importResolver);
  return this;
}

Assistant:

CcsDomain &CcsDomain::loadCcsStream(std::istream &stream,
    const std::string &fileName, ImportResolver &importResolver) {
  Loader loader(dag->root()->tracer());
  loader.loadCcsStream(stream, fileName, *dag, importResolver);
  return *this;
}